

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoopSwitch<duckdb::string_t,duckdb::string_t,duckdb::Equals,true,false>
                (string_t *ldata,string_t *rdata,SelectionVector *sel,idx_t count,ValidityMask *mask
                ,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  bool bVar2;
  idx_t iVar3;
  ulong uVar4;
  string_t *psVar5;
  ulong uVar6;
  ulong uVar7;
  sel_t sVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      iVar3 = SelectFlatLoop<duckdb::string_t,duckdb::string_t,duckdb::Equals,true,false,false,true>
                        (ldata,rdata,sel,count,mask,(SelectionVector *)0x0,false_sel);
      return iVar3;
    }
    if (count + 0x3f < 0x40) {
      iVar3 = 0;
    }
    else {
      iVar3 = 0;
      uVar7 = 0;
      uVar9 = 0;
      do {
        puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar6 = 0xffffffffffffffff;
        }
        else {
          uVar6 = puVar1[uVar7];
        }
        uVar11 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar11 = count;
        }
        uVar10 = uVar11;
        if (uVar6 != 0) {
          uVar10 = uVar9;
          if (uVar6 == 0xffffffffffffffff) {
            if (uVar9 < uVar11) {
              psVar5 = rdata + uVar9;
              do {
                uVar9 = uVar10;
                if (sel->sel_vector != (sel_t *)0x0) {
                  uVar9 = (ulong)sel->sel_vector[uVar10];
                }
                bVar2 = string_t::operator==(ldata,psVar5);
                true_sel->sel_vector[iVar3] = (sel_t)uVar9;
                iVar3 = iVar3 + bVar2;
                uVar10 = uVar10 + 1;
                psVar5 = psVar5 + 1;
              } while (uVar11 != uVar10);
            }
          }
          else if (uVar9 < uVar11) {
            psVar5 = rdata + uVar9;
            uVar10 = 0;
            do {
              if (sel->sel_vector == (sel_t *)0x0) {
                sVar8 = (int)uVar9 + (int)uVar10;
              }
              else {
                sVar8 = sel->sel_vector[uVar9 + uVar10];
              }
              if ((uVar6 >> (uVar10 & 0x3f) & 1) == 0) {
                uVar4 = 0;
              }
              else {
                bVar2 = string_t::operator==(ldata,psVar5);
                uVar4 = (ulong)bVar2;
              }
              true_sel->sel_vector[iVar3] = sVar8;
              iVar3 = iVar3 + uVar4;
              uVar10 = uVar10 + 1;
              psVar5 = psVar5 + 1;
            } while ((uVar9 - uVar11) + uVar10 != 0);
            uVar10 = uVar9 + uVar10;
          }
        }
        uVar7 = uVar7 + 1;
        uVar9 = uVar10;
      } while (uVar7 != count + 0x3f >> 6);
    }
  }
  else {
    iVar3 = SelectFlatLoop<duckdb::string_t,duckdb::string_t,duckdb::Equals,true,false,true,true>
                      (ldata,rdata,sel,count,mask,true_sel,false_sel);
  }
  return iVar3;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}